

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

real __thiscall fasttext::Matrix::dotRow(Matrix *this,Vector *vec,int64_t i)

{
  pointer pfVar1;
  uint __line;
  runtime_error *this_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  char *__assertion;
  undefined1 auVar5 [16];
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x25;
  }
  else if (i < this->m_) {
    pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1;
    uVar3 = lVar2 >> 2;
    if (uVar3 == this->n_) {
      auVar5 = ZEXT816(0) << 0x40;
      for (uVar4 = 0; (~(lVar2 >> 0x3f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
        auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)(this->data_).
                                                                                                            
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [i * uVar3 + uVar4]),ZEXT416((uint)pfVar1[uVar4]))
        ;
      }
      if (!NAN(auVar5._0_4_)) {
        return auVar5._0_4_;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Encountered NaN.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __assertion = "vec.size() == n_";
    __line = 0x27;
  }
  else {
    __assertion = "i < m_";
    __line = 0x26;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                ,__line,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
}

Assistant:

real Matrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return d;
}